

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_derive.c
# Opt level: O1

int derive(EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  uchar *key_00;
  uint in_ECX;
  size_t *in_R8;
  uchar ukm [32];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  ctx_00 = EVP_PKEY_CTX_new((EVP_PKEY *)ctx,(ENGINE *)0x0);
  if (ctx_00 == (EVP_PKEY_CTX *)0x0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_PKEY_CTX_new(keyA, NULL)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x11f);
  }
  iVar1 = EVP_PKEY_derive_init(ctx_00);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_derive_init(ctx)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x120);
  }
  iVar1 = EVP_PKEY_derive_set_peer(ctx_00,(EVP_PKEY *)key);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_derive_set_peer(ctx, keyB)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x121);
  }
  if ((int)keylen != 0) {
    iVar1 = EVP_PKEY_CTX_ctrl(ctx_00,-1,-1,0x100b,(int)keylen,(void *)0x0);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_PKEY_CTX_ctrl(ctx, -1, -1, EVP_PKEY_CTRL_SET_VKO, dgst_nid, NULL)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                  ,0x124);
    }
  }
  if (in_ECX != 0) {
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 1;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    if (0x20 < in_ECX) {
      OPENSSL_die("assertion failed: ukm_len <= sizeof(ukm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                  ,0x128);
    }
    iVar1 = EVP_PKEY_CTX_ctrl(ctx_00,-1,-1,8,in_ECX,&local_48);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_PKEY_CTX_ctrl(ctx, -1, -1, EVP_PKEY_CTRL_SET_IV, ukm_len, ukm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                  ,0x12a);
    }
  }
  iVar1 = EVP_PKEY_derive(ctx_00,(uchar *)0x0,in_R8);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_derive(ctx, NULL, len)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x12d);
  }
  key_00 = (uchar *)CRYPTO_malloc((int)*in_R8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                                  ,0x12f);
  if (key_00 != (uchar *)0x0) {
    iVar1 = EVP_PKEY_derive(ctx_00,key_00,in_R8);
    if (iVar1 != 0) {
      EVP_PKEY_CTX_free(ctx_00);
      return (int)key_00;
    }
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_derive(ctx, skey, len)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
                ,0x131);
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("skey = OPENSSL_malloc(*len)",
              "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_derive.c"
              ,0x12f);
}

Assistant:

unsigned char *derive(EVP_PKEY *keyA, EVP_PKEY *keyB, int dgst_nid,
                      int ukm_len, size_t *len)
{
    EVP_PKEY_CTX *ctx;
    T(ctx = EVP_PKEY_CTX_new(keyA, NULL));
    T(EVP_PKEY_derive_init(ctx));
    T(EVP_PKEY_derive_set_peer(ctx, keyB));
    if (dgst_nid)
        T(EVP_PKEY_CTX_ctrl(ctx, -1, -1, EVP_PKEY_CTRL_SET_VKO,
                            dgst_nid, NULL));
    if (ukm_len) {
        unsigned char ukm[32] = { 1 };

        OPENSSL_assert(ukm_len <= sizeof(ukm));
        T(EVP_PKEY_CTX_ctrl(ctx, -1, -1, EVP_PKEY_CTRL_SET_IV,
                            ukm_len, ukm));
    }

    T(EVP_PKEY_derive(ctx, NULL, len));
    unsigned char *skey;
    T(skey = OPENSSL_malloc(*len));

    T(EVP_PKEY_derive(ctx, skey, len));
#ifdef DEBUG
    BIO_dump_fp(stdout, skey, *len);
#endif
    EVP_PKEY_CTX_free(ctx);
    return skey;
}